

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2.cpp
# Opt level: O2

bool clusterG2(TSimilarityMap *sim,TKeyPressCollection *keyPresses)

{
  TValueCC TVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer psVar5;
  pointer pPVar6;
  pointer pPVar7;
  pointer pPVar8;
  pointer pPVar9;
  pointer pPVar10;
  ulong uVar11;
  int iVar12;
  size_t extraout_RDX;
  ulong uVar13;
  pointer *ppPVar14;
  ulong uVar15;
  undefined4 uVar16;
  long lVar17;
  long lVar18;
  pointer __p;
  uint uVar19;
  __normal_iterator<Pair_*,_std::vector<Pair,_std::allocator<Pair>_>_> __i;
  pointer pPVar20;
  undefined4 uVar21;
  float fVar22;
  undefined4 uVar23;
  allocator_type local_c1;
  pointer local_c0;
  vector<Pair,_std::allocator<Pair>_> local_b8;
  long local_a0;
  TKeyPressCollection *local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  long local_68;
  TSimilarityMap *local_60;
  long local_58;
  TValueCC local_50;
  vector<double,_std::allocator<double>_> nsum;
  
  psVar5 = (keyPresses->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
           ).super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_90 = ((long)(keyPresses->
                    super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                    super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar5) / 0x30;
  lVar18 = 0;
  local_80 = 0;
  if (0 < (int)local_90) {
    local_80 = local_90 & 0xffffffff;
  }
  local_a0 = local_80 * 0x30;
  iVar12 = 1;
  for (; local_a0 - lVar18 != 0; lVar18 = lVar18 + 0x30) {
    *(int *)((long)&psVar5->cid + lVar18) = iVar12;
    iVar12 = iVar12 + 1;
  }
  local_b8.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x3ff0000000000000;
  local_98 = keyPresses;
  std::vector<double,_std::allocator<double>_>::vector
            (&nsum,(long)((int)local_90 + 1),(value_type_conflict2 *)&local_b8,&local_c1);
  local_b8.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_b8.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_b8.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar12 = 1;
  if (1 < (int)local_90) {
    iVar12 = (int)local_90;
  }
  local_78 = (ulong)(iVar12 - 1);
  lVar18 = 1;
  pPVar20 = (pointer)0x0;
  pPVar8 = (pointer)0x0;
  uVar11 = local_90;
  uVar13 = 0;
  local_60 = sim;
  while (pPVar9 = local_b8.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.
                  super__Vector_impl_data._M_start, uVar13 != local_78) {
    local_70 = uVar13 + 1;
    lVar17 = uVar13 * 0x18;
    local_88 = uVar13;
    local_68 = lVar18;
    local_58 = lVar17;
    while( true ) {
      uVar16 = (undefined4)uVar13;
      iVar12 = (int)lVar18;
      if ((int)uVar11 <= iVar12) break;
      TVar1 = *(TValueCC *)
               (*(long *)((long)&(((sim->
                                   super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<stMatch,_std::allocator<stMatch>_>)._M_impl.
                                 super__Vector_impl_data + lVar17) + lVar18 * 0x10);
      uVar21 = SUB84(TVar1,0);
      uVar23 = (undefined4)((ulong)TVar1 >> 0x20);
      if (pPVar8 == pPVar20) {
        if ((long)pPVar20 - (long)pPVar9 == 0x7ffffffffffffff0) {
          local_b8.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data.
          _M_start = pPVar9;
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        __p = (pointer)((long)pPVar20 - (long)pPVar9 >> 4);
        pPVar8 = __p;
        if (pPVar20 == pPVar9) {
          pPVar8 = (pointer)0x1;
        }
        uVar13 = (long)&__p->i + (long)&pPVar8->i;
        if (0x7fffffffffffffe < uVar13) {
          uVar13 = 0x7ffffffffffffff;
        }
        if (CARRY8((ulong)pPVar8,(ulong)__p)) {
          uVar13 = 0x7ffffffffffffff;
        }
        local_c0 = pPVar9;
        if (uVar13 == 0) {
          pPVar9 = (pointer)0x0;
        }
        else {
          local_50 = TVar1;
          pPVar9 = (pointer)operator_new(uVar13 << 4);
          uVar16 = (undefined4)local_88;
          uVar21 = SUB84(local_50,0);
          uVar23 = (undefined4)((ulong)local_50 >> 0x20);
          uVar11 = extraout_RDX;
        }
        pPVar9[(long)__p].i = uVar16;
        pPVar9[(long)__p].j = iVar12;
        pPVar9[(long)__p].cc = (TValueCC)CONCAT44(uVar23,uVar21);
        pPVar6 = pPVar9;
        for (pPVar10 = local_c0; pPVar8 = pPVar6 + 1, pPVar10 != pPVar20; pPVar10 = pPVar10 + 1) {
          iVar12 = pPVar10->j;
          pPVar7 = (pointer)pPVar10->cc;
          pPVar6->i = pPVar10->i;
          pPVar6->j = iVar12;
          pPVar6->cc = (TValueCC)pPVar7;
          pPVar6 = pPVar8;
        }
        std::_Vector_base<Pair,_std::allocator<Pair>_>::_M_deallocate
                  ((_Vector_base<Pair,_std::allocator<Pair>_> *)local_c0,__p,uVar11);
        pPVar20 = pPVar9 + uVar13;
        uVar11 = local_90;
        uVar13 = local_88;
        lVar17 = local_58;
        sim = local_60;
        local_b8.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = pPVar20;
      }
      else {
        pPVar8->i = uVar16;
        pPVar8->j = iVar12;
        pPVar8->cc = TVar1;
        pPVar8 = pPVar8 + 1;
      }
      lVar18 = lVar18 + 1;
      local_b8.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data.
      _M_finish = pPVar8;
    }
    lVar18 = local_68 + 1;
    uVar13 = local_70;
    local_b8.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data.
    _M_start = pPVar9;
  }
  if (local_b8.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data.
      _M_start != pPVar8) {
    lVar17 = (long)pPVar8 -
             (long)local_b8.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.
                   super__Vector_impl_data._M_start;
    uVar11 = lVar17 >> 4;
    lVar18 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar18 == 0; lVar18 = lVar18 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair*,std::vector<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair,std::allocator<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_b8.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.
               super__Vector_impl_data._M_start,pPVar8,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar17 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair*,std::vector<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair,std::allocator<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pPVar9,pPVar8);
    }
    else {
      pPVar20 = pPVar9 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair*,std::vector<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair,std::allocator<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pPVar9,pPVar20);
      for (; pPVar20 != pPVar8; pPVar20 = pPVar20 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair*,std::vector<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair,std::allocator<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair>>>,__gnu_cxx::__ops::_Val_less_iter>
                  (pPVar20);
      }
    }
  }
  puts("[+] Top 10 pairs");
  ppPVar14 = (pointer *)&pPVar9->cc;
  for (uVar11 = 0; uVar11 != 10; uVar11 = uVar11 + 1) {
    printf("    Pair %d: %d %d %g\n",(int)*ppPVar14,uVar11 & 0xffffffff,
           (ulong)*(uint *)&((_Vector_impl_data *)(ppPVar14 + -1))->_M_start,
           (ulong)*(uint *)((long)ppPVar14 + -4));
    ppPVar14 = ppPVar14 + 2;
  }
  uVar11 = (ulong)((long)pPVar8 - (long)pPVar9) >> 4;
  uVar13 = uVar11 & 0xffffffff;
  if ((int)uVar11 < 1) {
    uVar13 = 0;
  }
  uVar11 = local_80;
  for (uVar15 = 0; uVar15 != uVar13; uVar15 = uVar15 + 1) {
    fVar22 = frand();
    pPVar20 = pPVar9 + uVar15;
    if ((double)fVar22 <= pPVar20->cc) {
      if (pPVar20->cc < 0.5) break;
      iVar12 = pPVar20->i;
      psVar5 = (local_98->
               super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
               super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar2 = pPVar20->j;
      iVar3 = psVar5[iVar12].cid;
      iVar4 = psVar5[iVar2].cid;
      if (iVar3 != iVar4) {
        if (iVar4 < iVar3) {
          iVar3 = iVar4;
        }
        for (lVar18 = 0; local_a0 != lVar18; lVar18 = lVar18 + 0x30) {
          iVar4 = *(int *)((long)&psVar5->cid + lVar18);
          if ((iVar4 == psVar5[iVar12].cid) || (iVar4 == psVar5[iVar2].cid)) {
            *(int *)((long)&psVar5->cid + lVar18) = iVar3;
          }
        }
        uVar19 = (int)uVar11 - 1;
        uVar11 = (ulong)uVar19;
        printf("Clusters %3d %5.4f:",uVar11);
        for (lVar18 = 0; local_a0 != lVar18; lVar18 = lVar18 + 0x30) {
          printf(" %3d",(ulong)*(uint *)((long)&((local_98->
                                                 super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                                 ).
                                                 super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->cid +
                                        lVar18));
        }
        putchar(10);
        if (uVar19 == 0x38) break;
      }
    }
  }
  std::vector<Pair,_std::allocator<Pair>_>::~vector(&local_b8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&nsum.super__Vector_base<double,_std::allocator<double>_>);
  return true;
}

Assistant:

bool clusterG2(TSimilarityMap & sim, TKeyPressCollection & keyPresses) {
    struct Pair {
        int i = -1;
        int j = -1;
        TValueCC cc = -1.0;

        bool operator < (const Pair & a) const { return cc > a.cc; }
    };

    int n = keyPresses.size();

    int nclusters = 0;
    for (int i = 0; i < n; ++i) {
        auto & ci = keyPresses[i].cid;

        ci = i + 1;
        ++nclusters;
    }

    std::vector<double> nsum(n + 1, 1.0);
    std::vector<Pair> ccpairs;
    for (int i = 0; i < n - 1; ++i) {
        for (int j = i + 1; j < n; ++j) {
            auto & cc = sim[i][j].cc;

            ccpairs.emplace_back(Pair{i, j, cc});
        }
    }

    std::sort(ccpairs.begin(), ccpairs.end());

    printf("[+] Top 10 pairs\n");
    for (int i = 0; i < 10; ++i) {
        printf("    Pair %d: %d %d %g\n", i, ccpairs[i].i, ccpairs[i].j, ccpairs[i].cc);
    }

    int npairs = ccpairs.size();
    for (int ip = 0; ip < npairs; ++ip) {
        auto & curpair = ccpairs[ip];
        if (frand() > curpair.cc) continue;
        if (curpair.cc < 0.50) break;

        auto & ci = keyPresses[curpair.i].cid;
        auto & cj = keyPresses[curpair.j].cid;

        if (ci == cj) continue;
        auto cnew = std::min(ci, cj);
        for (int k = 0; k < n; ++k) {
            auto & ck = keyPresses[k].cid;

            if (ck == ci || ck == cj) ck = cnew;
        }
        --nclusters;

        printf("Clusters %3d %5.4f:", nclusters, curpair.cc);
        for (int k = 0; k < n; ++k) {
            auto & ck = keyPresses[k].cid;

            printf(" %3d", ck);
        }
        printf("\n");

        if (nclusters == 56) break;
    }

    return true;
}